

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operation-order.cpp
# Opt level: O2

ostream * operator<<(ostream *os,Item *item)

{
  char *pcVar1;
  
  switch((item->super__Variant_base<Grammar::Product,_Grammar::Sum,_Grammar::Number,_Grammar::Paren>
         ).super__Move_assign_alias<Grammar::Product,_Grammar::Sum,_Grammar::Number,_Grammar::Paren>
         .super__Copy_assign_alias<Grammar::Product,_Grammar::Sum,_Grammar::Number,_Grammar::Paren>.
         super__Move_ctor_alias<Grammar::Product,_Grammar::Sum,_Grammar::Number,_Grammar::Paren>.
         super__Copy_ctor_alias<Grammar::Product,_Grammar::Sum,_Grammar::Number,_Grammar::Paren>.
         super__Variant_storage_alias<Grammar::Product,_Grammar::Sum,_Grammar::Number,_Grammar::Paren>
         ._M_index) {
  case '\0':
    pcVar1 = "*";
    break;
  case '\x01':
    pcVar1 = "+";
    break;
  case '\x02':
    std::get<2ul,Grammar::Product,Grammar::Sum,Grammar::Number,Grammar::Paren>(item);
    std::ostream::_M_insert<unsigned_long>((ulong)os);
    return os;
  case '\x03':
    pcVar1 = "(";
    break;
  default:
    goto switchD_00102481_default;
  }
  std::operator<<(os,pcVar1);
switchD_00102481_default:
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Grammar::Item& item) {
  if (std::holds_alternative<Grammar::Product>(item)) {
    os << "*";
  } else if (std::holds_alternative<Grammar::Sum>(item)) {
    os << "+";
  } else if (std::holds_alternative<Grammar::Number>(item)) {
    os << std::get<Grammar::Number>(item).value;
  } else if (std::holds_alternative<Grammar::Paren>(item)) {
    os << "(";
  }
  return os;
}